

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O1

istream * PyreNet::operator>>(istream *is,Layer *l)

{
  pointer pPVar1;
  activationType activation;
  ActivationFactory *this;
  Activation *pAVar2;
  Perceptron *p;
  pointer p_00;
  Perceptron local_78;
  undefined1 local_50 [8];
  string activationString;
  int nodesSize;
  
  this = ActivationFactory::getInstance();
  activationString._M_dataplus._M_p = (pointer)0x0;
  activationString._M_string_length._0_1_ = 0;
  local_50 = (undefined1  [8])&activationString._M_string_length;
  std::operator>>(is,(string *)local_50);
  activation = ActivationFactory::fromString((string *)local_50);
  pAVar2 = ActivationFactory::getActivation(this,activation);
  l->activation = pAVar2;
  std::istream::operator>>((istream *)is,(int *)(activationString.field_2._M_local_buf + 0xc));
  Perceptron::Perceptron(&local_78,0);
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::resize
            (&l->nodes,(long)(int)activationString.field_2._12_4_,&local_78);
  if (local_78.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar1 = (l->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_00 = (l->nodes).
              super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
              super__Vector_impl_data._M_start; p_00 != pPVar1; p_00 = p_00 + 1) {
    operator>>(is,p_00);
  }
  if (local_50 != (undefined1  [8])&activationString._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(activationString._M_string_length._1_7_,
                             (undefined1)activationString._M_string_length) + 1);
  }
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, Layer &l) {
        ActivationFactory* activationFactory = ActivationFactory::getInstance();
        std::string activationString;
        is >> activationString;
        l.activation = activationFactory->getActivation(ActivationFactory::fromString(activationString));
        int nodesSize;
        is >> nodesSize;
        l.nodes.resize(nodesSize, Perceptron(0));
        for (Perceptron& p : l.nodes)
            is >> p;
        return is;
    }